

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

bool FIX::double_conversion::FastFixedDtoa
               (double v,int fractional_count,Vector<char> buffer,int *length,int *decimal_point)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  uint64_t d64;
  char *pcVar5;
  uint uVar6;
  uint32_t number;
  ulong uVar7;
  double_conversion *this;
  byte bVar8;
  uint uVar9;
  int iVar10;
  double_conversion *this_00;
  int *in_R9;
  int index;
  bool bVar11;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  int *in_stack_ffffffffffffff90;
  Vector<char> buffer_local;
  Vector<char> local_40;
  
  local_40.start_ = buffer.start_;
  uVar6 = buffer.length_;
  bVar11 = ((ulong)v & 0x7ff0000000000000) == 0;
  this = (double_conversion *)((ulong)v & 0xfffffffffffff) + 0x10000000000000;
  if (bVar11) {
    this = (double_conversion *)((ulong)v & 0xfffffffffffff);
  }
  uVar9 = 0xfffffbce;
  if (!bVar11) {
    uVar9 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
  }
  bVar11 = fractional_count < 0x15 && (int)uVar9 < 0x15;
  if (fractional_count >= 0x15 || (int)uVar9 >= 0x15) {
    return bVar11;
  }
  *length = 0;
  bVar8 = (byte)uVar9;
  number = (uint32_t)buffer.start_;
  local_40.length_ = uVar6;
  buffer_local.start_ = local_40.start_;
  buffer_local.length_ = uVar6;
  if ((int)uVar9 < 0xc) {
    auVar4 = buffer._0_12_;
    if ((int)uVar9 < 0) {
      if (uVar9 < 0xffffffcc) {
        if (uVar9 < 0xffffff80) {
          pcVar5 = Vector<char>::operator[](&buffer_local,0);
          *pcVar5 = '\0';
          *length = 0;
          *decimal_point = -fractional_count;
          local_40.start_ = buffer_local.start_;
          local_40.length_ = buffer_local.length_;
          goto LAB_00180de7;
        }
        *decimal_point = 0;
      }
      else {
        this_00 = (double_conversion *)((ulong)this >> (-bVar8 & 0x3f));
        this = this + -((long)this_00 << (-bVar8 & 0x3f));
        if ((ulong)this_00 >> 0x20 == 0) {
          buffer_03.start_ = (char *)(ulong)uVar6;
          buffer_03._8_8_ = length;
          FillDigits32(this_00,number,buffer_03,(int *)(ulong)(uint)fractional_count);
        }
        else {
          buffer_01._12_4_ = 0;
          buffer_01.start_ = (char *)auVar4._0_8_;
          buffer_01.length_ = auVar4._8_4_;
          FillDigits64((uint64_t)this_00,buffer_01,length);
        }
        *decimal_point = *length;
      }
      buffer_07.start_ = (char *)(ulong)uVar6;
      buffer_07._8_8_ = length;
      FillFractionals(this,(ulong)uVar9,fractional_count,number,buffer_07,decimal_point,
                      in_stack_ffffffffffffff90);
      goto LAB_00180de7;
    }
    buffer_00._12_4_ = 0;
    buffer_00.start_ = (char *)auVar4._0_8_;
    buffer_00.length_ = auVar4._8_4_;
    FillDigits64((long)this << (bVar8 & 0x3f),buffer_00,length);
  }
  else {
    if (uVar9 < 0x12) {
      uVar7 = 0xb1a2bc2ec5 << (0x11 - bVar8 & 0x3f);
      uVar9 = (uint)((ulong)this / uVar7);
      uVar7 = (ulong)this % uVar7 << (bVar8 & 0x3f);
    }
    else {
      uVar7 = (long)this << (bVar8 - 0x11 & 0x3f);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar7;
      uVar9 = SUB164(auVar2 / ZEXT816(0xb1a2bc2ec5),0);
      uVar7 = uVar7 % 0xb1a2bc2ec5 << 0x11;
    }
    buffer_02.start_ = (char *)(ulong)uVar6;
    buffer_02._8_8_ = length;
    FillDigits32((double_conversion *)(ulong)uVar9,number,buffer_02,
                 (int *)(ulong)(uint)fractional_count);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar7;
    buffer_04.start_ = (char *)(ulong)uVar6;
    buffer_04._8_8_ = length;
    FillDigits32FixedLength
              ((double_conversion *)(ulong)SUB164(auVar3 / ZEXT816(100000000000000),0),3,number,
               buffer_04,in_R9);
    buffer_05.start_ = (char *)(ulong)uVar6;
    buffer_05._8_8_ = length;
    FillDigits32FixedLength
              ((double_conversion *)((uVar7 / 10000000) % 10000000),7,number,buffer_05,in_R9);
    buffer_06.start_ = (char *)(ulong)uVar6;
    buffer_06._8_8_ = length;
    FillDigits32FixedLength((double_conversion *)(uVar7 % 10000000),7,number,buffer_06,in_R9);
  }
  *decimal_point = *length;
LAB_00180de7:
  iVar10 = *length;
  while ((0 < iVar10 && (pcVar5 = Vector<char>::operator[](&local_40,iVar10 + -1), *pcVar5 == '0')))
  {
    iVar10 = *length + -1;
    *length = iVar10;
  }
  iVar10 = 0;
  while ((iVar10 < *length && (pcVar5 = Vector<char>::operator[](&local_40,iVar10), *pcVar5 == '0'))
        ) {
    iVar10 = iVar10 + 1;
  }
  if (iVar10 != 0) {
    index = 0;
    while( true ) {
      if (*length <= iVar10 + index) break;
      pcVar5 = Vector<char>::operator[](&local_40,iVar10 + index);
      cVar1 = *pcVar5;
      pcVar5 = Vector<char>::operator[](&local_40,index);
      *pcVar5 = cVar1;
      index = index + 1;
    }
    *length = *length - iVar10;
    *decimal_point = *decimal_point - iVar10;
  }
  pcVar5 = Vector<char>::operator[](&buffer_local,*length);
  *pcVar5 = '\0';
  if (*length == 0) {
    *decimal_point = -fractional_count;
  }
  return bVar11;
}

Assistant:

bool FastFixedDtoa(double v,
                   int fractional_count,
                   Vector<char> buffer,
                   int* length,
                   int* decimal_point) {
  const uint32_t kMaxUInt32 = 0xFFFFFFFF;
  uint64_t significand = Double(v).Significand();
  int exponent = Double(v).Exponent();
  // v = significand * 2^exponent (with significand a 53bit integer).
  // If the exponent is larger than 20 (i.e. we may have a 73bit number) then we
  // don't know how to compute the representation. 2^73 ~= 9.5*10^21.
  // If necessary this limit could probably be increased, but we don't need
  // more.
  if (exponent > 20) return false;
  if (fractional_count > 20) return false;
  *length = 0;
  // At most kDoubleSignificandSize bits of the significand are non-zero.
  // Given a 64 bit integer we have 11 0s followed by 53 potentially non-zero
  // bits:  0..11*..0xxx..53*..xx
  if (exponent + kDoubleSignificandSize > 64) {
    // The exponent must be > 11.
    //
    // We know that v = significand * 2^exponent.
    // And the exponent > 11.
    // We simplify the task by dividing v by 10^17.
    // The quotient delivers the first digits, and the remainder fits into a 64
    // bit number.
    // Dividing by 10^17 is equivalent to dividing by 5^17*2^17.
    const uint64_t kFive17 = UINT64_2PART_C(0xB1, A2BC2EC5);  // 5^17
    uint64_t divisor = kFive17;
    int divisor_power = 17;
    uint64_t dividend = significand;
    uint32_t quotient;
    uint64_t remainder;
    // Let v = f * 2^e with f == significand and e == exponent.
    // Then need q (quotient) and r (remainder) as follows:
    //   v            = q * 10^17       + r
    //   f * 2^e      = q * 10^17       + r
    //   f * 2^e      = q * 5^17 * 2^17 + r
    // If e > 17 then
    //   f * 2^(e-17) = q * 5^17        + r/2^17
    // else
    //   f  = q * 5^17 * 2^(17-e) + r/2^e
    if (exponent > divisor_power) {
      // We only allow exponents of up to 20 and therefore (17 - e) <= 3
      dividend <<= exponent - divisor_power;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << divisor_power;
    } else {
      divisor <<= divisor_power - exponent;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << exponent;
    }
    FillDigits32(quotient, buffer, length);
    FillDigits64FixedLength(remainder, buffer, length);
    *decimal_point = *length;
  } else if (exponent >= 0) {
    // 0 <= exponent <= 11
    significand <<= exponent;
    FillDigits64(significand, buffer, length);
    *decimal_point = *length;
  } else if (exponent > -kDoubleSignificandSize) {
    // We have to cut the number.
    uint64_t integrals = significand >> -exponent;
    uint64_t fractionals = significand - (integrals << -exponent);
    if (integrals > kMaxUInt32) {
      FillDigits64(integrals, buffer, length);
    } else {
      FillDigits32(static_cast<uint32_t>(integrals), buffer, length);
    }
    *decimal_point = *length;
    FillFractionals(fractionals, exponent, fractional_count,
                    buffer, length, decimal_point);
  } else if (exponent < -128) {
    // This configuration (with at most 20 digits) means that all digits must be
    // 0.
    ASSERT(fractional_count <= 20);
    buffer[0] = '\0';
    *length = 0;
    *decimal_point = -fractional_count;
  } else {
    *decimal_point = 0;
    FillFractionals(significand, exponent, fractional_count,
                    buffer, length, decimal_point);
  }
  TrimZeros(buffer, length, decimal_point);
  buffer[*length] = '\0';
  if ((*length) == 0) {
    // The string is empty and the decimal_point thus has no importance. Mimick
    // Gay's dtoa and and set it to -fractional_count.
    *decimal_point = -fractional_count;
  }
  return true;
}